

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::TextureBarrierBasicOutline::verifyTextureData(TextureBarrierBasicOutline *this)

{
  GLuint GVar1;
  int iVar2;
  undefined4 extraout_var;
  GLuint *pGVar3;
  GLuint x;
  uint x_00;
  GLuint i;
  ulong uVar4;
  GLuint y;
  GLuint y_00;
  
  iVar2 = (*((this->super_TextureBarrierBaseTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  for (uVar4 = 0; uVar4 != 8; uVar4 = uVar4 + 1) {
    (**(code **)(CONCAT44(extraout_var,iVar2) + 8))((uint)uVar4 | 0x84c0);
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0xaa0))(0xde1,0,0x8d94,0x1405,this->m_actual);
    for (x_00 = 0; x_00 < this->m_width; x_00 = x_00 + 1) {
      y_00 = 0;
      while (y_00 < this->m_height) {
        pGVar3 = texel(this,this->m_reference[uVar4],x_00,y_00);
        GVar1 = *pGVar3;
        pGVar3 = texel(this,this->m_actual,x_00,y_00);
        y_00 = y_00 + 1;
        if (GVar1 != *pGVar3) goto LAB_00abb3d0;
      }
    }
  }
LAB_00abb3d0:
  return 7 < uVar4;
}

Assistant:

bool verifyTextureData()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		for (GLuint i = 0; i < NUM_TEXTURES; ++i)
		{
			gl.activeTexture(GL_TEXTURE0 + i);
			gl.getTexImage(GL_TEXTURE_2D, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, m_actual);

			for (GLuint x = 0; x < m_width; ++x)
				for (GLuint y = 0; y < m_height; ++y)
				{
					if (texel(m_reference[i], x, y) != texel(m_actual, x, y))
					{
						return false;
					}
				}
		}

		return true;
	}